

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void print_learned_mocks(void)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Constraint *constraint;
  char *function_name;
  RecordedExpectation *expectation;
  CgreenBreadcrumb *breadcrumb;
  int i;
  int c;
  int e;
  int in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffffd8;
  CgreenBreadcrumb *in_stack_ffffffffffffffe0;
  int local_8;
  int local_4;
  
  get_test_reporter();
  walk_breadcrumb(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  fprintf(_stderr,": Learned mocks are\n");
  iVar1 = cgreen_vector_size(learned_mock_calls);
  if (iVar1 == 0) {
    fprintf(_stderr,"\t<none>\n");
  }
  else {
    local_4 = 0;
    while( true ) {
      iVar1 = local_4;
      iVar2 = cgreen_vector_size(learned_mock_calls);
      if (iVar2 <= iVar1) break;
      puVar3 = (undefined8 *)
               cgreen_vector_get((CgreenVector *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),0);
      fprintf(_stderr,"\texpect(%s",*puVar3);
      local_8 = 0;
      while( true ) {
        in_stack_ffffffffffffffc8 = local_8;
        iVar2 = cgreen_vector_size((CgreenVector *)puVar3[3]);
        if (iVar2 <= in_stack_ffffffffffffffc8) break;
        pvVar4 = cgreen_vector_get((CgreenVector *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),0);
        if (*(int *)((long)pvVar4 + 0x40) == 2) {
          fprintf(_stderr,", when(%s, is_equal_to_double(%f))",*(undefined8 *)((long)pvVar4 + 0x48),
                  *(undefined8 *)((long)pvVar4 + 0x58));
        }
        else {
          fprintf(_stderr,", when(%s, is_equal_to(%ld))",*(undefined8 *)((long)pvVar4 + 0x58),
                  *(undefined8 *)((long)pvVar4 + 0x48));
        }
        local_8 = local_8 + 1;
      }
      fprintf(_stderr,");\n");
      local_4 = local_4 + 1;
    }
  }
  return;
}

Assistant:

void print_learned_mocks(void) {
    int e, c, i = 0;
    CgreenBreadcrumb *breadcrumb = get_test_reporter()->breadcrumb;

    walk_breadcrumb(breadcrumb, &show_breadcrumb, (void *) &i);

    fprintf(stderr, ": Learned mocks are\n");

    if (cgreen_vector_size(learned_mock_calls) == 0) {
        fprintf(stderr, "\t<none>\n");
        return;
    }

    for (e = 0; e < cgreen_vector_size(learned_mock_calls); e++) {
        RecordedExpectation *expectation = (RecordedExpectation*)cgreen_vector_get(learned_mock_calls, e);
        const char *function_name = expectation->function;
        fprintf(stderr, "\texpect(%s", function_name);
        for (c = 0; c < cgreen_vector_size(expectation->constraints); c++) {
            Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, c);
            if (constraint->expected_value.type == CGREEN_DOUBLE)
                fprintf(stderr, ", when(%s, is_equal_to_double(%f))", constraint->expected_value_name,
                        constraint->expected_value.value.double_value);
            else
                fprintf(stderr, ", when(%s, is_equal_to(%" PRIdPTR "))", constraint->expected_value_name,
                        constraint->expected_value.value.integer_value);
        }
        fprintf(stderr, ");\n");
    }
}